

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMUnaryOp.cpp
# Opt level: O3

void __thiscall xercesc_4_0::CMUnaryOp::calcFirstPos(CMUnaryOp *this,CMStateSet *toSet)

{
  CMNode *pCVar1;
  CMStateSet *pCVar2;
  
  pCVar1 = this->fChild;
  pCVar2 = pCVar1->fFirstPos;
  if (pCVar2 == (CMStateSet *)0x0) {
    pCVar2 = (CMStateSet *)XMemory::operator_new(0x20,pCVar1->fMemoryManager);
    CMStateSet::CMStateSet(pCVar2,(ulong)pCVar1->fMaxStates,pCVar1->fMemoryManager);
    pCVar1->fFirstPos = pCVar2;
    (*pCVar1->_vptr_CMNode[3])(pCVar1,pCVar2);
    pCVar2 = pCVar1->fFirstPos;
  }
  CMStateSet::operator=(toSet,pCVar2);
  return;
}

Assistant:

void CMUnaryOp::calcFirstPos(CMStateSet& toSet) const
{
    // Its just based on our child node's first pos
    toSet = fChild->getFirstPos();
}